

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

angle_t FNodeBuilder::PointToAngle(fixed_t x,fixed_t y)

{
  double dVar1;
  double ang;
  double rad2bam;
  fixed_t y_local;
  fixed_t x_local;
  
  dVar1 = c_atan2((double)y,(double)x);
  return (int)(dVar1 * 341782637.7882158) << 1;
}

Assistant:

angle_t FNodeBuilder::PointToAngle (fixed_t x, fixed_t y)
{
	const double rad2bam = double(1<<30) / M_PI;
#if defined __APPLE__ && !defined __llvm__
	// Work-around for vectorization issue in Apple's GCC 4.x
	// See https://gcc.gnu.org/wiki/Math_Optimization_Flags for details
	long double ang = atan2l (double(y), double(x));
#else // !__APPLE__ || __llvm__
	double ang = g_atan2 (double(y), double(x));
#endif // __APPLE__ && !__llvm__
	// Convert to signed first since negative double to unsigned is undefined.
	return angle_t(int(ang * rad2bam)) << 1;
}